

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

token_vector * cpptempl::tokenize(string *text,token_vector *tokens)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  element_type *peVar4;
  int iVar5;
  long lVar6;
  TokenVar *pTVar7;
  TokenFor *pTVar8;
  TokenText *__p;
  undefined8 uVar9;
  _func_int **pp_Var10;
  _Alloc_hider _Var11;
  bool bVar12;
  string expression;
  string pre_text;
  shared_ptr<cpptempl::Token> local_190;
  undefined1 local_180 [16];
  TokenVar *local_170;
  undefined1 local_168 [24];
  undefined1 local_150 [16];
  element_type local_140 [2];
  TokenVar *local_130;
  pointer local_128;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  undefined1 local_108 [24];
  TokenVar *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  char *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  long local_a8;
  size_type local_a0 [2];
  string local_90;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  do {
    if (text->_M_string_length == 0) {
      return tokens;
    }
    lVar6 = std::__cxx11::string::find((char *)text,0x1f52c6,0);
    if (lVar6 == -1) {
      sVar2 = text->_M_string_length;
      if (sVar2 == 0) {
        return tokens;
      }
      __p = (TokenText *)operator_new(0x28);
      pcVar3 = (text->_M_dataplus)._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar3,pcVar3 + sVar2);
      (__p->super_Token)._vptr_Token = (_func_int **)&PTR_gettype_0020b850;
      (__p->m_text)._M_dataplus._M_p = (pointer)&(__p->m_text).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__p->m_text,local_50,local_48 + (long)local_50);
      local_150._0_8_ = __p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenText*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 8),__p);
      std::vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
      ::emplace_back<std::shared_ptr<cpptempl::Token>>
                ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                  *)tokens,(shared_ptr<cpptempl::Token> *)local_150);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
      }
      if (local_50 == local_40) {
        return tokens;
      }
      operator_delete(local_50,local_40[0] + 1);
      return tokens;
    }
    std::__cxx11::string::substr((ulong)local_150,(ulong)text);
    uVar9 = local_150._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pTVar7 = (TokenVar *)operator_new(0x28);
      local_d0 = local_c8._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_150._0_8_,(long)(_func_int ***)local_150._0_8_ + uVar9);
      (pTVar7->super_Token)._vptr_Token = (_func_int **)&PTR_gettype_0020b850;
      (pTVar7->m_key)._M_dataplus._M_p = (pointer)&(pTVar7->m_key).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar7->m_key,local_d0,local_d0 + local_c8._M_allocated_capacity);
      local_170 = pTVar7;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenText*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_168,(TokenText *)pTVar7);
      std::vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
      ::emplace_back<std::shared_ptr<cpptempl::Token>>
                ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                  *)tokens,(shared_ptr<cpptempl::Token> *)&local_170);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._0_8_);
      }
      if (local_d0 != local_c8._M_local_buf + 8) {
        operator_delete(local_d0,local_c8._8_8_ + 1);
      }
    }
    std::__cxx11::string::substr((ulong)&local_170,(ulong)text);
    std::__cxx11::string::operator=((string *)text,(string *)&local_170);
    if (local_170 != (TokenVar *)(local_168 + 8)) {
      operator_delete(local_170,local_168._8_8_ + 1);
    }
    sVar2 = text->_M_string_length;
    if (sVar2 == 0) {
      pTVar7 = (TokenVar *)operator_new(0x28);
      local_f0 = (TokenVar *)local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"{","");
      (pTVar7->super_Token)._vptr_Token = (_func_int **)&PTR_gettype_0020b850;
      (pTVar7->m_key)._M_dataplus._M_p = (pointer)&(pTVar7->m_key).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar7->m_key,local_f0,
                 (long)&(local_f0->super_Token)._vptr_Token + local_e8);
      local_170 = pTVar7;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenText*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_168,(TokenText *)pTVar7);
      std::vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
      ::emplace_back<std::shared_ptr<cpptempl::Token>>
                ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                  *)tokens,(shared_ptr<cpptempl::Token> *)&local_170);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._0_8_);
      }
      pp_Var10 = (_func_int **)local_e0._0_8_;
      pTVar7 = local_f0;
      if (local_f0 != (TokenVar *)local_e0) {
LAB_00147e0f:
        operator_delete(pTVar7,(long)pp_Var10 + 1);
      }
    }
    else {
      cVar1 = *(text->_M_dataplus)._M_p;
      if (cVar1 == '%') {
        lVar6 = std::__cxx11::string::find((char *)text,0x17c547,0);
        if (lVar6 != -1) {
          std::__cxx11::string::substr((ulong)&local_190,(ulong)text);
          nonius::trim_copy_if<nonius::detail::is_spaceF>((string *)&local_170,(string *)&local_190)
          ;
          if ((TokenFor *)
              local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (TokenFor *)local_180) {
            operator_delete(local_190.
                            super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            local_180._0_8_ + 1);
          }
          std::__cxx11::string::substr((ulong)&local_190,(ulong)text);
          std::__cxx11::string::operator=((string *)text,(string *)&local_190);
          if ((TokenFor *)
              local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (TokenFor *)local_180) {
            operator_delete(local_190.
                            super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            local_180._0_8_ + 1);
          }
          local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_180;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"for","");
          peVar4 = local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((ulong)local_168._0_8_ <
              local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi) {
            bVar12 = false;
          }
          else if (local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            bVar12 = true;
          }
          else {
            iVar5 = bcmp(local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,local_170,
                         (size_t)local_190.
                                 super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
            bVar12 = iVar5 == 0;
          }
          if (peVar4 != (element_type *)local_180) {
            operator_delete(peVar4,local_180._0_8_ + 1);
          }
          if (bVar12) {
            pTVar8 = (TokenFor *)operator_new(0x60);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,local_170,
                       (long)&(local_170->super_Token)._vptr_Token + local_168._0_8_);
            TokenFor::TokenFor(pTVar8,&local_90);
            local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)pTVar8;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenFor*>
                      (&local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,pTVar8);
            std::
            vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
            ::emplace_back<std::shared_ptr<cpptempl::Token>>
                      ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                        *)tokens,&local_190);
            if (local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            uVar9 = local_90.field_2._M_allocated_capacity;
            _Var11._M_p = local_90._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_00147df3;
          }
          else {
            local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_180;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"if","");
            peVar4 = local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((ulong)local_168._0_8_ <
                local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi) {
              bVar12 = false;
            }
            else if (local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              bVar12 = true;
            }
            else {
              iVar5 = bcmp(local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,local_170,
                           (size_t)local_190.
                                   super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi);
              bVar12 = iVar5 == 0;
            }
            if (peVar4 != (element_type *)local_180) {
              operator_delete(peVar4,local_180._0_8_ + 1);
            }
            if (bVar12) {
              pTVar8 = (TokenFor *)operator_new(0x40);
              local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_108 + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_110,local_170,
                         (long)&(local_170->super_Token)._vptr_Token + local_168._0_8_);
              (pTVar8->super_Token)._vptr_Token = (_func_int **)&PTR_gettype_0020b8e0;
              (pTVar8->m_key)._M_dataplus._M_p = (pointer)&(pTVar8->m_key).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&pTVar8->m_key,local_110,
                         local_110->_M_local_buf + local_108._0_8_);
              (pTVar8->m_val)._M_dataplus._M_p = (pointer)0x0;
              (pTVar8->m_val)._M_string_length = 0;
              (pTVar8->m_val).field_2._M_allocated_capacity = 0;
              local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)pTVar8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenIf*>
                        (&local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(TokenIf *)pTVar8);
              std::
              vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
              ::emplace_back<std::shared_ptr<cpptempl::Token>>
                        ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                          *)tokens,&local_190);
              if (local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              uVar9 = local_108._8_8_;
              _Var11._M_p = (pointer)local_110;
              if (local_110 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_108 + 8)) {
LAB_00147df3:
                operator_delete(_Var11._M_p,uVar9 + 1);
              }
            }
            else {
              pTVar8 = (TokenFor *)operator_new(0x28);
              nonius::trim_copy_if<nonius::detail::is_spaceF>(&local_b0,(string *)&local_170);
              (pTVar8->super_Token)._vptr_Token = (_func_int **)&PTR_gettype_0020b928;
              (pTVar8->m_key)._M_dataplus._M_p = (pointer)&(pTVar8->m_key).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&pTVar8->m_key,local_b0,local_b0->_M_local_buf + local_a8);
              local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)pTVar8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenEnd*>
                        (&local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(TokenEnd *)pTVar8);
              std::
              vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
              ::emplace_back<std::shared_ptr<cpptempl::Token>>
                        ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                          *)tokens,&local_190);
              if (local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_190.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              uVar9 = local_a0[0];
              _Var11._M_p = (pointer)local_b0;
              if (local_b0 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0) goto LAB_00147df3;
            }
          }
LAB_00147dfb:
          pp_Var10 = (_func_int **)local_168._8_8_;
          pTVar7 = local_170;
          if (local_170 != (TokenVar *)(local_168 + 8)) goto LAB_00147e0f;
        }
      }
      else if (cVar1 == '$') {
        lVar6 = std::__cxx11::string::find((char *)text,0x17c547,0);
        if (lVar6 != -1) {
          pTVar7 = (TokenVar *)operator_new(0x28);
          std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
          (pTVar7->super_Token)._vptr_Token = (_func_int **)&PTR_gettype_0020b898;
          (pTVar7->m_key)._M_dataplus._M_p = (pointer)&(pTVar7->m_key).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pTVar7->m_key,local_70,local_68 + (long)local_70);
          local_170 = pTVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenVar*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_168,pTVar7);
          std::
          vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
          ::emplace_back<std::shared_ptr<cpptempl::Token>>
                    ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                      *)tokens,(shared_ptr<cpptempl::Token> *)&local_170);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._0_8_);
          }
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
          std::__cxx11::string::substr((ulong)&local_170,(ulong)text);
          std::__cxx11::string::operator=((string *)text,(string *)&local_170);
          goto LAB_00147dfb;
        }
      }
      else {
        pTVar7 = (TokenVar *)operator_new(0x28);
        local_130 = (TokenVar *)local_120;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"{","");
        (pTVar7->super_Token)._vptr_Token = (_func_int **)&PTR_gettype_0020b850;
        (pTVar7->m_key)._M_dataplus._M_p = (pointer)&(pTVar7->m_key).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar7->m_key,local_130,
                   (long)&(local_128->
                          super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                   (long)&(local_130->super_Token)._vptr_Token);
        local_170 = pTVar7;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::TokenText*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_168,(TokenText *)pTVar7);
        std::
        vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>::
        emplace_back<std::shared_ptr<cpptempl::Token>>
                  ((vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
                    *)tokens,(shared_ptr<cpptempl::Token> *)&local_170);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._0_8_);
        }
        pp_Var10 = (_func_int **)local_120._0_8_;
        pTVar7 = local_130;
        if (local_130 != (TokenVar *)local_120) goto LAB_00147e0f;
      }
    }
    if ((element_type *)local_150._0_8_ != local_140) {
      operator_delete((void *)local_150._0_8_,(long)local_140[0]._vptr_Token + 1);
    }
    if (sVar2 == 0) {
      return tokens;
    }
  } while( true );
}

Assistant:

inline token_vector & tokenize(std::string text, token_vector &tokens)
    {
        while(! text.empty())
        {
            size_t pos = text.find("{") ;
            if (pos == std::string::npos)
            {
                if (! text.empty())
                {
                    tokens.push_back(token_ptr(new TokenText(text))) ;
                }
                return tokens ;
            }
            std::string pre_text = text.substr(0, pos) ;
            if (! pre_text.empty())
            {
                tokens.push_back(token_ptr(new TokenText(pre_text))) ;
            }
            text = text.substr(pos+1) ;
            if (text.empty())
            {
                tokens.push_back(token_ptr(new TokenText("{"))) ;
                return tokens ;
            }

            // variable
            if (text[0] == '$')
            {
                pos = text.find("}") ;
                if (pos != std::string::npos)
                {
                    tokens.push_back(token_ptr (new TokenVar(text.substr(1, pos-1)))) ;
                    text = text.substr(pos+1) ;
                }
            }
            // control statement
            else if (text[0] == '%')
            {
                pos = text.find("}") ;
                if (pos != std::string::npos)
                {
                    std::string expression = nonius::trim_copy(text.substr(1, pos-2)) ;
                    text = text.substr(pos+1) ;
                    if (nonius::starts_with(expression, "for"))
                    {
                        tokens.push_back(token_ptr (new TokenFor(expression))) ;
                    }
                    else if (nonius::starts_with(expression, "if"))
                    {
                        tokens.push_back(token_ptr (new TokenIf(expression))) ;
                    }
                    else
                    {
                        tokens.push_back(token_ptr (new TokenEnd(nonius::trim_copy(expression)))) ;
                    }
                }
            }
            else
            {
                tokens.push_back(token_ptr(new TokenText("{"))) ;
            }
        }
        return tokens ;
    }